

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_string
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          string_type *buffer,error_code *ec)

{
  size_t *psVar1;
  value_type *pvVar2;
  pointer ppVar3;
  value_type *pvVar4;
  type_conflict2 tVar5;
  size_t sVar6;
  bson_errc __e;
  size_t length;
  size_t __n;
  ulong uVar7;
  uint8_t buf [4];
  
  pvVar2 = (this->source_).current_;
  uVar7 = (long)(this->source_).end_ - (long)pvVar2;
  __n = 4;
  if (uVar7 < 4) {
    __n = uVar7;
  }
  memcpy(buf,pvVar2,__n);
  (this->source_).current_ = pvVar2 + __n;
  psVar1 = &(this->state_stack_).
            super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
  *psVar1 = *psVar1 + __n;
  __e = unexpected_eof;
  if (3 < uVar7) {
    if ((long)(int)buf < 1) {
      __e = string_length_is_non_positive;
    }
    else {
      length = (long)(int)buf - 1;
      tVar5 = source_reader<jsoncons::bytes_source>::read<std::__cxx11::string>
                        (&this->source_,buffer,length);
      ppVar3 = (this->state_stack_).
               super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sVar6 = ppVar3[-1].pos + tVar5;
      ppVar3[-1].pos = sVar6;
      if (tVar5 == length) {
        pvVar2 = (this->source_).current_;
        pvVar4 = (this->source_).end_;
        uVar7 = (ulong)(pvVar4 != pvVar2);
        (this->source_).current_ = pvVar2 + uVar7;
        ppVar3[-1].pos = sVar6 + uVar7;
        if (pvVar4 != pvVar2) {
          return;
        }
      }
    }
  }
  std::error_code::operator=(ec,__e);
  this->more_ = false;
  return;
}

Assistant:

void read_string(string_type& buffer, std::error_code& ec)
    {
        uint8_t buf[sizeof(int32_t)]; 
        std::size_t n = source_.read(buf, sizeof(int32_t));
        state_stack_.back().pos += n;
        if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
        if (JSONCONS_UNLIKELY(len < 1))
        {
            ec = bson_errc::string_length_is_non_positive;
            more_ = false;
            return;
        }

        std::size_t size = static_cast<std::size_t>(len) - static_cast<std::size_t>(1);
        n = source_reader<Source>::read(source_, buffer, size);
        state_stack_.back().pos += n;

        if (JSONCONS_UNLIKELY(n != size))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
        uint8_t c;
        n = source_.read(&c, 1);
        state_stack_.back().pos += n;
        if (JSONCONS_UNLIKELY(n != 1))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }
    }